

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  BVH *bvh;
  size_t sVar4;
  void *pvVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  vbool<4> vVar23;
  size_t sVar24;
  char cVar25;
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  AABBNodeMB4D *node1;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  NodeRef root;
  ulong uVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  NodeRef *pNVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar38 [64];
  vint4 bi_13;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_2;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 ai_3;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  float fVar77;
  float fVar78;
  vint4 bi;
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 bi_1;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vfloat4 a0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar108;
  undefined1 auVar109 [64];
  undefined1 local_1968 [8];
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar22 = mm_lookupmask_ps._8_8_;
  uVar21 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar4 = (bvh->root).ptr;
  if (sVar4 != 8) {
    auVar43 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar36 = vpcmpeqd_avx(auVar43,(undefined1  [16])valid_i->field_0);
    auVar43 = *(undefined1 (*) [16])(ray + 0x80);
    auVar39 = ZEXT816(0) << 0x40;
    auVar44 = vcmpps_avx(auVar43,auVar39,5);
    auVar44 = vandps_avx(auVar44,auVar36);
    uVar30 = vmovmskps_avx(auVar44);
    if (uVar30 != 0) {
      uVar31 = (ulong)(uVar30 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar36._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar36._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar36._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar36._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar36 = vfmadd231ps_fma(auVar36,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar66 = vfmadd231ps_fma(auVar36,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar36 = vrsqrtps_avx(auVar66);
      fVar73 = auVar36._0_4_;
      fVar77 = auVar36._4_4_;
      fVar78 = auVar36._8_4_;
      fVar79 = auVar36._12_4_;
      auVar65._0_4_ = fVar73 * fVar73 * fVar73 * auVar66._0_4_ * -0.5;
      auVar65._4_4_ = fVar77 * fVar77 * fVar77 * auVar66._4_4_ * -0.5;
      auVar65._8_4_ = fVar78 * fVar78 * fVar78 * auVar66._8_4_ * -0.5;
      auVar65._12_4_ = fVar79 * fVar79 * fVar79 * auVar66._12_4_ * -0.5;
      auVar80._8_4_ = 0x3fc00000;
      auVar80._0_8_ = 0x3fc000003fc00000;
      auVar80._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar80,auVar36,auVar65);
      auVar66._8_4_ = 0x80000000;
      auVar66._0_8_ = 0x8000000080000000;
      auVar66._12_4_ = 0x80000000;
      while (uVar31 != 0) {
        lVar32 = 0;
        for (uVar33 = uVar31; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar33 = (ulong)(uint)((int)lVar32 * 4);
        auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar33 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar33 + 0x50)),0x1c);
        auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + uVar33 + 0x60)),0x28);
        fVar73 = *(float *)((long)pre.ray_space + (uVar33 - 0x10));
        auVar90._0_4_ = auVar36._0_4_ * fVar73;
        auVar90._4_4_ = auVar36._4_4_ * fVar73;
        auVar90._8_4_ = auVar36._8_4_ * fVar73;
        auVar90._12_4_ = auVar36._12_4_ * fVar73;
        auVar65 = vshufpd_avx(auVar90,auVar90,1);
        auVar36 = vmovshdup_avx(auVar90);
        auVar99._0_4_ = auVar36._0_4_ ^ 0x80000000;
        auVar36 = vunpckhps_avx(auVar90,auVar39);
        auVar99._4_12_ = ZEXT812(0) << 0x20;
        auVar84 = vshufps_avx(auVar36,auVar99,0x41);
        auVar95._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
        auVar95._8_8_ = auVar65._8_8_ ^ auVar66._8_8_;
        auVar80 = vinsertps_avx(auVar95,auVar90,0x2a);
        auVar36 = vdpps_avx(auVar84,auVar84,0x7f);
        auVar65 = vdpps_avx(auVar80,auVar80,0x7f);
        auVar36 = vcmpps_avx(auVar65,auVar36,1);
        auVar103._0_4_ = auVar36._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        auVar36 = vblendvps_avx(auVar80,auVar84,auVar103);
        auVar65 = vdpps_avx(auVar36,auVar36,0x7f);
        auVar80 = vrsqrtss_avx(auVar65,auVar65);
        fVar77 = auVar80._0_4_;
        fVar77 = fVar77 * 1.5 - auVar65._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
        auVar96._0_4_ = auVar36._0_4_ * fVar77;
        auVar96._4_4_ = auVar36._4_4_ * fVar77;
        auVar96._8_4_ = auVar36._8_4_ * fVar77;
        auVar96._12_4_ = auVar36._12_4_ * fVar77;
        auVar36 = vshufps_avx(auVar96,auVar96,0xc9);
        auVar65 = vshufps_avx(auVar90,auVar90,0xc9);
        auVar104._0_4_ = auVar96._0_4_ * auVar65._0_4_;
        auVar104._4_4_ = auVar96._4_4_ * auVar65._4_4_;
        auVar104._8_4_ = auVar96._8_4_ * auVar65._8_4_;
        auVar104._12_4_ = auVar96._12_4_ * auVar65._12_4_;
        auVar36 = vfmsub231ps_fma(auVar104,auVar90,auVar36);
        auVar80 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar36 = vdpps_avx(auVar80,auVar80,0x7f);
        uVar31 = uVar31 - 1 & uVar31;
        auVar65 = vrsqrtss_avx(auVar36,auVar36);
        fVar77 = auVar65._0_4_;
        fVar77 = fVar77 * 1.5 - auVar36._0_4_ * 0.5 * fVar77 * fVar77 * fVar77;
        auVar100._0_4_ = fVar77 * auVar80._0_4_;
        auVar100._4_4_ = fVar77 * auVar80._4_4_;
        auVar100._8_4_ = fVar77 * auVar80._8_4_;
        auVar100._12_4_ = fVar77 * auVar80._12_4_;
        auVar84._0_4_ = fVar73 * auVar90._0_4_;
        auVar84._4_4_ = fVar73 * auVar90._4_4_;
        auVar84._8_4_ = fVar73 * auVar90._8_4_;
        auVar84._12_4_ = fVar73 * auVar90._12_4_;
        auVar80 = vunpcklps_avx(auVar96,auVar84);
        auVar36 = vunpckhps_avx(auVar96,auVar84);
        auVar84 = vunpcklps_avx(auVar100,auVar39);
        auVar65 = vunpckhps_avx(auVar100,auVar39);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar36,auVar65);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar80,auVar84);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar80,auVar84);
        pre.ray_space[lVar32].vx.field_0 = aVar13;
        pre.ray_space[lVar32].vy.field_0 = aVar11;
        pre.ray_space[lVar32].vz.field_0 = aVar12;
      }
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar85._8_4_ = 0x7fffffff;
      auVar85._0_8_ = 0x7fffffff7fffffff;
      auVar85._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx(auVar85,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar91._8_4_ = 0x219392ef;
      auVar91._0_8_ = 0x219392ef219392ef;
      auVar91._12_4_ = 0x219392ef;
      auVar36 = vcmpps_avx(auVar36,auVar91,1);
      auVar39 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar91,auVar36);
      auVar36 = vandps_avx(auVar85,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar36 = vcmpps_avx(auVar36,auVar91,1);
      auVar66 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar91,auVar36);
      auVar36 = vandps_avx(auVar85,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar36 = vcmpps_avx(auVar36,auVar91,1);
      auVar36 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar91,auVar36);
      auVar65 = vrcpps_avx(auVar39);
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar39 = vfnmadd213ps_fma(auVar39,auVar65,auVar86);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar39,auVar65,auVar65)
      ;
      auVar39 = vrcpps_avx(auVar66);
      auVar66 = vfnmadd213ps_fma(auVar66,auVar39,auVar86);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar66,auVar39,auVar39)
      ;
      auVar39 = vrcpps_avx(auVar36);
      auVar36 = vfnmadd213ps_fma(auVar36,auVar39,auVar86);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar36,auVar39,auVar39)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar39 = ZEXT416(0) << 0x20;
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar39,1);
      auVar58._8_4_ = 0x10;
      auVar58._0_8_ = 0x1000000010;
      auVar58._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar36,auVar58);
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar39,5);
      auVar59._8_4_ = 0x20;
      auVar59._0_8_ = 0x2000000020;
      auVar59._12_4_ = 0x20;
      auVar67._8_4_ = 0x30;
      auVar67._0_8_ = 0x3000000030;
      auVar67._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar67,auVar59,auVar36);
      auVar36 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar39,5);
      auVar45._8_4_ = 0x40;
      auVar45._0_8_ = 0x4000000040;
      auVar45._12_4_ = 0x40;
      auVar50._8_4_ = 0x50;
      auVar50._0_8_ = 0x5000000050;
      auVar50._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar50,auVar45,auVar36);
      auVar36 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar39);
      auVar43 = vmaxps_avx(auVar43,auVar39);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar109 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar36,auVar44);
      auVar39._8_4_ = 0xff800000;
      auVar39._0_8_ = 0xff800000ff800000;
      auVar39._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar39,auVar43,auVar44);
      auVar43 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar44._0_4_ ^ auVar43._0_4_;
      terminated.field_0._4_4_ = auVar44._4_4_ ^ auVar43._4_4_;
      terminated.field_0._8_4_ = auVar44._8_4_ ^ auVar43._8_4_;
      terminated.field_0._12_4_ = auVar44._12_4_ ^ auVar43._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar30 = 3;
      }
      else {
        uVar30 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar4;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_01554f76:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01555665;
          pNVar35 = pNVar35 + -1;
          paVar34 = paVar34 + -1;
          aVar108 = *paVar34;
          auVar43 = vcmpps_avx((undefined1  [16])aVar108,(undefined1  [16])tray.tfar.field_0,1);
          uVar27 = vmovmskps_avx(auVar43);
        } while (uVar27 == 0);
        uVar31 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar30 < uVar27) {
LAB_01554fb8:
          vVar23.field_0 = terminated.field_0;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01555665;
              auVar43 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar108,6);
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar43[0xf] < '\0') {
                bVar3 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar5 = This->leafIntersector;
                valid_o.field_0._0_8_ = uVar21;
                valid_o.field_0._8_8_ = uVar22;
                uVar27 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                uVar31 = (ulong)(uVar27 ^ 0xf);
                while (uVar31 != 0) {
                  lVar32 = 0;
                  for (uVar33 = uVar31; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000
                      ) {
                    lVar32 = lVar32 + 1;
                  }
                  uVar31 = uVar31 - 1 & uVar31;
                  cVar25 = (**(code **)((long)pvVar5 + (ulong)bVar3 * 0x40 + 0x18))
                                     (&pre,ray,lVar32,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar109 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  if (cVar25 != '\0') {
                    valid_o.field_0.i[lVar32] = -1;
                  }
                }
                auVar14._8_8_ = valid_o.field_0._8_8_;
                auVar14._0_8_ = valid_o.field_0._0_8_;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])vVar23.field_0,auVar14);
                auVar43 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar43[0xf]) goto LAB_01555665;
                auVar49._8_4_ = 0xff800000;
                auVar49._0_8_ = 0xff800000ff800000;
                auVar49._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_01554f76;
            }
            uVar31 = root.ptr & 0xfffffffffffffff0;
            uVar27 = (uint)root.ptr & 7;
            auVar43 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar108,6);
            auVar38 = ZEXT1664(auVar43);
            aVar108 = auVar109._0_16_;
            root.ptr = 8;
            for (lVar32 = -0x10;
                (lVar32 != 0 && (sVar4 = *(size_t *)(uVar31 + 0x20 + lVar32 * 2), sVar4 != 8));
                lVar32 = lVar32 + 4) {
              if ((uVar27 == 6) || (uVar27 == 1)) {
                uVar28 = *(undefined4 *)(uVar31 + 0x90 + lVar32);
                auVar51._4_4_ = uVar28;
                auVar51._0_4_ = uVar28;
                auVar51._8_4_ = uVar28;
                auVar51._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x30 + lVar32);
                auVar46._4_4_ = uVar28;
                auVar46._0_4_ = uVar28;
                auVar46._8_4_ = uVar28;
                auVar46._12_4_ = uVar28;
                auVar43 = *(undefined1 (*) [16])(ray + 0x70);
                auVar36 = vfmadd231ps_fma(auVar46,auVar43,auVar51);
                uVar28 = *(undefined4 *)(uVar31 + 0xb0 + lVar32);
                auVar52._4_4_ = uVar28;
                auVar52._0_4_ = uVar28;
                auVar52._8_4_ = uVar28;
                auVar52._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x50 + lVar32);
                auVar60._4_4_ = uVar28;
                auVar60._0_4_ = uVar28;
                auVar60._8_4_ = uVar28;
                auVar60._12_4_ = uVar28;
                auVar39 = vfmadd231ps_fma(auVar60,auVar43,auVar52);
                uVar28 = *(undefined4 *)(uVar31 + 0xd0 + lVar32);
                auVar53._4_4_ = uVar28;
                auVar53._0_4_ = uVar28;
                auVar53._8_4_ = uVar28;
                auVar53._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x70 + lVar32);
                auVar68._4_4_ = uVar28;
                auVar68._0_4_ = uVar28;
                auVar68._8_4_ = uVar28;
                auVar68._12_4_ = uVar28;
                auVar66 = vfmadd231ps_fma(auVar68,auVar43,auVar53);
                uVar28 = *(undefined4 *)(uVar31 + 0xa0 + lVar32);
                auVar54._4_4_ = uVar28;
                auVar54._0_4_ = uVar28;
                auVar54._8_4_ = uVar28;
                auVar54._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x40 + lVar32);
                auVar74._4_4_ = uVar28;
                auVar74._0_4_ = uVar28;
                auVar74._8_4_ = uVar28;
                auVar74._12_4_ = uVar28;
                auVar65 = vfmadd231ps_fma(auVar74,auVar43,auVar54);
                uVar28 = *(undefined4 *)(uVar31 + 0xc0 + lVar32);
                auVar55._4_4_ = uVar28;
                auVar55._0_4_ = uVar28;
                auVar55._8_4_ = uVar28;
                auVar55._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x60 + lVar32);
                auVar81._4_4_ = uVar28;
                auVar81._0_4_ = uVar28;
                auVar81._8_4_ = uVar28;
                auVar81._12_4_ = uVar28;
                auVar80 = vfmadd231ps_fma(auVar81,auVar43,auVar55);
                uVar28 = *(undefined4 *)(uVar31 + 0xe0 + lVar32);
                auVar56._4_4_ = uVar28;
                auVar56._0_4_ = uVar28;
                auVar56._8_4_ = uVar28;
                auVar56._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x80 + lVar32);
                auVar87._4_4_ = uVar28;
                auVar87._0_4_ = uVar28;
                auVar87._8_4_ = uVar28;
                auVar87._12_4_ = uVar28;
                auVar84 = vfmadd231ps_fma(auVar87,auVar43,auVar56);
                auVar18._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar18._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar18._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar18._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar90 = vfmsub213ps_fma(auVar36,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar18);
                auVar19._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar19._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar19._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar19._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar95 = vfmsub213ps_fma(auVar39,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar19);
                auVar20._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar20._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar20._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar20._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar96 = vfmsub213ps_fma(auVar66,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar20);
                auVar66 = vfmsub213ps_fma(auVar65,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar18);
                auVar65 = vfmsub213ps_fma(auVar80,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar19);
                auVar80 = vfmsub213ps_fma(auVar84,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar20);
                auVar36 = vpminsd_avx(auVar90,auVar66);
                auVar39 = vpminsd_avx(auVar95,auVar65);
                auVar36 = vpmaxsd_avx(auVar36,auVar39);
                auVar39 = vpminsd_avx(auVar96,auVar80);
                auVar36 = vpmaxsd_avx(auVar36,auVar39);
                auVar39 = vpmaxsd_avx(auVar90,auVar66);
                auVar66 = vpmaxsd_avx(auVar95,auVar65);
                auVar65 = vpminsd_avx(auVar39,auVar66);
                auVar39 = vpmaxsd_avx(auVar96,auVar80);
                auVar66 = vpmaxsd_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
                auVar39 = vpminsd_avx(auVar65,auVar39);
                auVar39 = vpminsd_avx(auVar39,(undefined1  [16])tray.tfar.field_0);
                if (uVar27 == 6) {
                  auVar39 = vcmpps_avx(auVar66,auVar39,2);
                  uVar28 = *(undefined4 *)(uVar31 + 0xf0 + lVar32);
                  auVar64._4_4_ = uVar28;
                  auVar64._0_4_ = uVar28;
                  auVar64._8_4_ = uVar28;
                  auVar64._12_4_ = uVar28;
                  auVar66 = vcmpps_avx(auVar64,auVar43,2);
                  uVar28 = *(undefined4 *)(uVar31 + 0x100 + lVar32);
                  auVar72._4_4_ = uVar28;
                  auVar72._0_4_ = uVar28;
                  auVar72._8_4_ = uVar28;
                  auVar72._12_4_ = uVar28;
                  auVar43 = vcmpps_avx(auVar43,auVar72,1);
                  auVar43 = vandps_avx(auVar66,auVar43);
                  auVar43 = vandps_avx(auVar43,auVar39);
                }
                else {
                  auVar43 = vcmpps_avx(auVar66,auVar39,2);
                }
              }
              else {
                uVar28 = *(undefined4 *)(uVar31 + 0x30 + lVar32);
                auVar75._4_4_ = uVar28;
                auVar75._0_4_ = uVar28;
                auVar75._8_4_ = uVar28;
                auVar75._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x40 + lVar32);
                auVar69._4_4_ = uVar28;
                auVar69._0_4_ = uVar28;
                auVar69._8_4_ = uVar28;
                auVar69._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x50 + lVar32);
                auVar61._4_4_ = uVar28;
                auVar61._0_4_ = uVar28;
                auVar61._8_4_ = uVar28;
                auVar61._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x60 + lVar32);
                auVar92._4_4_ = uVar28;
                auVar92._0_4_ = uVar28;
                auVar92._8_4_ = uVar28;
                auVar92._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x70 + lVar32);
                auVar88._4_4_ = uVar28;
                auVar88._0_4_ = uVar28;
                auVar88._8_4_ = uVar28;
                auVar88._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0x80 + lVar32);
                auVar82._4_4_ = uVar28;
                auVar82._0_4_ = uVar28;
                auVar82._8_4_ = uVar28;
                auVar82._12_4_ = uVar28;
                fVar73 = *(float *)(uVar31 + 0x90 + lVar32);
                auVar97._4_4_ = fVar73;
                auVar97._0_4_ = fVar73;
                auVar97._8_4_ = fVar73;
                auVar97._12_4_ = fVar73;
                fVar77 = *(float *)(uVar31 + 0xa0 + lVar32);
                auVar101._4_4_ = fVar77;
                auVar101._0_4_ = fVar77;
                auVar101._8_4_ = fVar77;
                auVar101._12_4_ = fVar77;
                fVar78 = *(float *)(uVar31 + 0xb0 + lVar32);
                auVar105._4_4_ = fVar78;
                auVar105._0_4_ = fVar78;
                auVar105._8_4_ = fVar78;
                auVar105._12_4_ = fVar78;
                uVar28 = *(undefined4 *)(uVar31 + 0xc0 + lVar32);
                auVar57._4_4_ = uVar28;
                auVar57._0_4_ = uVar28;
                auVar57._8_4_ = uVar28;
                auVar57._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0xd0 + lVar32);
                auVar47._4_4_ = uVar28;
                auVar47._0_4_ = uVar28;
                auVar47._8_4_ = uVar28;
                auVar47._12_4_ = uVar28;
                uVar28 = *(undefined4 *)(uVar31 + 0xe0 + lVar32);
                auVar40._4_4_ = uVar28;
                auVar40._0_4_ = uVar28;
                auVar40._8_4_ = uVar28;
                auVar40._12_4_ = uVar28;
                auVar17._4_4_ = tray.org.field_0._36_4_;
                auVar17._0_4_ = tray.org.field_0._32_4_;
                auVar17._8_4_ = tray.org.field_0._40_4_;
                auVar17._12_4_ = tray.org.field_0._44_4_;
                auVar43 = vfmadd231ps_fma(auVar57,auVar17,auVar97);
                auVar36 = vfmadd231ps_fma(auVar47,auVar17,auVar101);
                auVar39 = vfmadd231ps_fma(auVar40,auVar17,auVar105);
                auVar107._0_4_ = fVar73 * (float)tray.dir.field_0._32_4_;
                auVar107._4_4_ = fVar73 * (float)tray.dir.field_0._36_4_;
                auVar107._8_4_ = fVar73 * (float)tray.dir.field_0._40_4_;
                auVar107._12_4_ = fVar73 * (float)tray.dir.field_0._44_4_;
                auVar102._0_4_ = fVar77 * (float)tray.dir.field_0._32_4_;
                auVar102._4_4_ = fVar77 * (float)tray.dir.field_0._36_4_;
                auVar102._8_4_ = fVar77 * (float)tray.dir.field_0._40_4_;
                auVar102._12_4_ = fVar77 * (float)tray.dir.field_0._44_4_;
                auVar98._0_4_ = fVar78 * (float)tray.dir.field_0._32_4_;
                auVar98._4_4_ = fVar78 * (float)tray.dir.field_0._36_4_;
                auVar98._8_4_ = fVar78 * (float)tray.dir.field_0._40_4_;
                auVar98._12_4_ = fVar78 * (float)tray.dir.field_0._44_4_;
                auVar66 = vfmadd231ps_fma(auVar107,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar92);
                auVar65 = vfmadd231ps_fma(auVar102,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar88);
                auVar80 = vfmadd231ps_fma(auVar98,auVar82,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar16._4_4_ = tray.org.field_0._20_4_;
                auVar16._0_4_ = tray.org.field_0._16_4_;
                auVar16._8_4_ = tray.org.field_0._24_4_;
                auVar16._12_4_ = tray.org.field_0._28_4_;
                auVar43 = vfmadd231ps_fma(auVar43,auVar16,auVar92);
                fVar73 = *(float *)(uVar31 + 0xf0 + lVar32);
                auVar36 = vfmadd231ps_fma(auVar36,auVar16,auVar88);
                fVar77 = *(float *)(uVar31 + 0x100 + lVar32);
                auVar39 = vfmadd231ps_fma(auVar39,auVar16,auVar82);
                fVar78 = *(float *)(uVar31 + 0x110 + lVar32);
                auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar75);
                auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar69);
                auVar80 = vfmadd231ps_fma(auVar80,auVar61,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar15._4_4_ = tray.org.field_0._4_4_;
                auVar15._0_4_ = tray.org.field_0._0_4_;
                auVar15._8_4_ = tray.org.field_0._8_4_;
                auVar15._12_4_ = tray.org.field_0._12_4_;
                auVar84 = vfmadd231ps_fma(auVar43,auVar15,auVar75);
                fVar79 = *(float *)(uVar31 + 0x120 + lVar32);
                auVar90 = vfmadd231ps_fma(auVar36,auVar15,auVar69);
                fVar1 = *(float *)(uVar31 + 0x130 + lVar32);
                auVar95 = vfmadd231ps_fma(auVar39,auVar15,auVar61);
                fVar2 = *(float *)(uVar31 + 0x140 + lVar32);
                auVar43 = *(undefined1 (*) [16])(ray + 0x70);
                fVar7 = auVar43._0_4_;
                auVar93._0_4_ = fVar73 * fVar7;
                fVar8 = auVar43._4_4_;
                auVar93._4_4_ = fVar73 * fVar8;
                fVar9 = auVar43._8_4_;
                auVar93._8_4_ = fVar73 * fVar9;
                fVar10 = auVar43._12_4_;
                auVar93._12_4_ = fVar73 * fVar10;
                auVar70._0_4_ = fVar77 * fVar7;
                auVar70._4_4_ = fVar77 * fVar8;
                auVar70._8_4_ = fVar77 * fVar9;
                auVar70._12_4_ = fVar77 * fVar10;
                auVar62._0_4_ = fVar7 * fVar78;
                auVar62._4_4_ = fVar8 * fVar78;
                auVar62._8_4_ = fVar9 * fVar78;
                auVar62._12_4_ = fVar10 * fVar78;
                auVar41._8_4_ = 0x3f800000;
                auVar41._0_8_ = 0x3f8000003f800000;
                auVar41._12_4_ = 0x3f800000;
                auVar43 = vsubps_avx(auVar41,auVar43);
                auVar36 = ZEXT816(0) << 0x40;
                auVar96 = vfmadd231ps_fma(auVar93,auVar43,auVar36);
                auVar99 = vfmadd231ps_fma(auVar70,auVar43,auVar36);
                auVar100 = vfmadd231ps_fma(auVar62,auVar43,auVar36);
                fVar73 = auVar43._0_4_;
                auVar76._0_4_ = fVar73 + fVar7 * fVar79;
                fVar77 = auVar43._4_4_;
                auVar76._4_4_ = fVar77 + fVar8 * fVar79;
                fVar78 = auVar43._8_4_;
                auVar76._8_4_ = fVar78 + fVar9 * fVar79;
                fVar106 = auVar43._12_4_;
                auVar76._12_4_ = fVar106 + fVar10 * fVar79;
                auVar83._0_4_ = fVar73 + fVar7 * fVar1;
                auVar83._4_4_ = fVar77 + fVar8 * fVar1;
                auVar83._8_4_ = fVar78 + fVar9 * fVar1;
                auVar83._12_4_ = fVar106 + fVar10 * fVar1;
                local_1968._4_4_ = fVar77 + fVar8 * fVar2;
                local_1968._0_4_ = fVar73 + fVar7 * fVar2;
                fStack_1960 = fVar78 + fVar9 * fVar2;
                fStack_195c = fVar106 + fVar10 * fVar2;
                auVar43 = vandps_avx(auVar66,auVar85);
                auVar37._8_4_ = 0x219392ef;
                auVar37._0_8_ = 0x219392ef219392ef;
                auVar37._12_4_ = 0x219392ef;
                auVar43 = vcmpps_avx(auVar43,auVar37,1);
                auVar36 = vblendvps_avx(auVar66,auVar37,auVar43);
                auVar43 = vandps_avx(auVar65,auVar85);
                auVar43 = vcmpps_avx(auVar43,auVar37,1);
                auVar39 = vblendvps_avx(auVar65,auVar37,auVar43);
                auVar43 = vandps_avx(auVar80,auVar85);
                auVar43 = vcmpps_avx(auVar43,auVar37,1);
                auVar43 = vblendvps_avx(auVar80,auVar37,auVar43);
                auVar38 = ZEXT1664(auVar38._0_16_);
                auVar66 = vrcpps_avx(auVar36);
                auVar36 = vfnmadd213ps_fma(auVar36,auVar66,auVar41);
                auVar66 = vfmadd132ps_fma(auVar36,auVar66,auVar66);
                auVar36 = vrcpps_avx(auVar39);
                auVar39 = vfnmadd213ps_fma(auVar39,auVar36,auVar41);
                auVar39 = vfmadd132ps_fma(auVar39,auVar36,auVar36);
                auVar36 = vrcpps_avx(auVar43);
                auVar43 = vfnmadd213ps_fma(auVar43,auVar36,auVar41);
                auVar65 = vfmadd132ps_fma(auVar43,auVar36,auVar36);
                auVar43 = vsubps_avx(auVar96,auVar84);
                auVar36 = vsubps_avx(auVar76,auVar84);
                auVar109 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar94._0_4_ = auVar66._0_4_ * auVar43._0_4_;
                auVar94._4_4_ = auVar66._4_4_ * auVar43._4_4_;
                auVar94._8_4_ = auVar66._8_4_ * auVar43._8_4_;
                auVar94._12_4_ = auVar66._12_4_ * auVar43._12_4_;
                auVar89._0_4_ = auVar66._0_4_ * auVar36._0_4_;
                auVar89._4_4_ = auVar66._4_4_ * auVar36._4_4_;
                auVar89._8_4_ = auVar66._8_4_ * auVar36._8_4_;
                auVar89._12_4_ = auVar66._12_4_ * auVar36._12_4_;
                auVar43 = vsubps_avx(auVar99,auVar90);
                auVar36 = vsubps_avx(auVar83,auVar90);
                auVar71._0_4_ = auVar39._0_4_ * auVar43._0_4_;
                auVar71._4_4_ = auVar39._4_4_ * auVar43._4_4_;
                auVar71._8_4_ = auVar39._8_4_ * auVar43._8_4_;
                auVar71._12_4_ = auVar39._12_4_ * auVar43._12_4_;
                auVar48._0_4_ = auVar39._0_4_ * auVar36._0_4_;
                auVar48._4_4_ = auVar39._4_4_ * auVar36._4_4_;
                auVar48._8_4_ = auVar39._8_4_ * auVar36._8_4_;
                auVar48._12_4_ = auVar39._12_4_ * auVar36._12_4_;
                auVar43 = vsubps_avx(auVar100,auVar95);
                auVar63._0_4_ = auVar65._0_4_ * auVar43._0_4_;
                auVar63._4_4_ = auVar65._4_4_ * auVar43._4_4_;
                auVar63._8_4_ = auVar65._8_4_ * auVar43._8_4_;
                auVar63._12_4_ = auVar65._12_4_ * auVar43._12_4_;
                auVar43 = vsubps_avx(_local_1968,auVar95);
                auVar42._0_4_ = auVar65._0_4_ * auVar43._0_4_;
                auVar42._4_4_ = auVar65._4_4_ * auVar43._4_4_;
                auVar42._8_4_ = auVar65._8_4_ * auVar43._8_4_;
                auVar42._12_4_ = auVar65._12_4_ * auVar43._12_4_;
                auVar43 = vpminsd_avx(auVar94,auVar89);
                auVar36 = vpminsd_avx(auVar71,auVar48);
                auVar43 = vpmaxsd_avx(auVar43,auVar36);
                auVar36 = vpminsd_avx(auVar63,auVar42);
                auVar36 = vpmaxsd_avx(auVar43,auVar36);
                auVar43 = vpmaxsd_avx(auVar94,auVar89);
                auVar39 = vpmaxsd_avx(auVar71,auVar48);
                auVar66 = vpminsd_avx(auVar43,auVar39);
                auVar43 = vpmaxsd_avx(auVar63,auVar42);
                auVar39 = vpmaxsd_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
                auVar43 = vpminsd_avx(auVar66,auVar43);
                auVar43 = vpminsd_avx(auVar43,(undefined1  [16])tray.tfar.field_0);
                auVar43 = vcmpps_avx(auVar39,auVar43,2);
              }
              auVar43 = vandps_avx(auVar43,auVar38._0_16_);
              auVar43 = vpslld_avx(auVar43,0x1f);
              sVar24 = root.ptr;
              aVar6 = aVar108;
              if (((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar43[0xf] < '\0') &&
                 (aVar6 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          vblendvps_avx(auVar109._0_16_,auVar36,auVar43), sVar24 = sVar4,
                 root.ptr != 8)) {
                pNVar35->ptr = root.ptr;
                pNVar35 = pNVar35 + 1;
                *paVar34 = aVar108;
                paVar34 = paVar34 + 1;
              }
              aVar108 = aVar6;
              root.ptr = sVar24;
            }
            if (root.ptr == 8) goto LAB_0155549b;
            auVar43 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar108,6);
            uVar28 = vmovmskps_avx(auVar43);
          } while ((byte)uVar30 < (byte)POPCOUNT(uVar28));
          pNVar35->ptr = root.ptr;
          pNVar35 = pNVar35 + 1;
          *paVar34 = aVar108;
          paVar34 = paVar34 + 1;
LAB_0155549b:
          iVar29 = 4;
        }
        else {
          while (uVar31 != 0) {
            sVar4 = 0;
            for (uVar33 = uVar31; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              sVar4 = sVar4 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            bVar26 = occluded1(This,bvh,root,sVar4,&pre,ray,&tray,context);
            if (bVar26) {
              terminated.field_0.i[sVar4] = -1;
            }
          }
          auVar43 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar109 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            auVar43._8_4_ = 0xff800000;
            auVar43._0_8_ = 0xff800000ff800000;
            auVar43._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar43,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar30 < uVar27) goto LAB_01554fb8;
        }
      } while (iVar29 != 3);
LAB_01555665:
      auVar43 = vandps_avx(auVar44,(undefined1  [16])terminated.field_0);
      auVar44._8_4_ = 0xff800000;
      auVar44._0_8_ = 0xff800000ff800000;
      auVar44._12_4_ = 0xff800000;
      auVar43 = vmaskmovps_avx(auVar43,auVar44);
      *(undefined1 (*) [16])(ray + 0x80) = auVar43;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }